

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O0

void adios2::helper::anon_unknown_8::CommDummyError(string *msg)

{
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_d0 [7];
  LogMode in_stack_ffffffffffffff37;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  undefined1 local_29 [41];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"Helper",(allocator *)__lhs);
  __rhs = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"adiosCommDummy",__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"CommDummyError",&local_89);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::operator+(__lhs,(char *)__rhs);
  Log(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
      in_stack_ffffffffffffff38,in_stack_ffffffffffffff37);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  abort();
}

Assistant:

void CommDummyError(const std::string &msg)
{
    helper::Log("Helper", "adiosCommDummy", "CommDummyError",
                "CommDummy: a function returned error code '" + msg + "'. Aborting!",
                helper::FATALERROR);
    std::abort();
}